

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.hpp
# Opt level: O1

string * __thiscall
njoy::ENDFtk::tree::File::content_abi_cxx11_(string *__return_storage_ptr__,File *this)

{
  int args_1;
  _Rb_tree_node_base *p_Var1;
  undefined8 *puVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  StructureDivision local_78;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (p_Var1 = (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->sections_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var1[1]._M_right);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    args_1 = this->mat_;
    local_80.container = __return_storage_ptr__;
    if (args_1 < 1) {
      tools::Log::error<char_const*>("Illegal material number (MAT) specified in FEND record");
      tools::Log::info<char_const*>("FEND records require a material number greater than 0");
      tools::Log::info<char_const*,int>("Specified material number: {}",args_1);
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = getenv;
      __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
    }
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = 0.0;
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl = 0;
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
         0;
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
    super__Head_base<5UL,_long,_false>._M_head_impl = (_Head_base<5UL,_long,_false>)0;
    local_78.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
    super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0;
    local_78.tail.fields._M_elems[1] = 0;
    local_78.tail.fields._M_elems[2] = 0;
    local_78.tail.fields._M_elems[0] = args_1;
    StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_78,&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

auto content() const {

      std::string content;
      for ( const auto& section : this->sections() ) {

        content += section.content();
      }

      if ( content.size() ) {

        auto output = std::back_inserter( content );
        FEND( this->MAT() ).print( output );
      }

      return content;
    }